

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall
clipp::detail::scoped_dfs_traverser::repeat_group_continues(scoped_dfs_traverser *this)

{
  bool bVar1;
  group *pgVar2;
  group *pgVar3;
  long in_RDI;
  group *curRepGroup;
  depth_first_traverser *in_stack_00000030;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x9a) & 1) == 0) {
    local_1 = false;
  }
  else {
    pgVar2 = group::depth_first_traverser::innermost_repeat_group(in_stack_00000030);
    if (pgVar2 == (group *)0x0) {
      local_1 = false;
    }
    else {
      pgVar3 = group::depth_first_traverser::innermost_repeat_group(in_stack_00000030);
      if (pgVar2 == pgVar3) {
        bVar1 = group::depth_first_traverser::operator_cast_to_bool
                          ((depth_first_traverser *)0x195139);
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool repeat_group_continues() const
    {
        if(!repeatGroupContinues_) return false;
        const auto curRepGroup = pos_.innermost_repeat_group();
        if(!curRepGroup) return false;
        if(curRepGroup != lastMatch_.innermost_repeat_group()) return false;
        if(!posAfterLastMatch_) return false;
        return true;
    }